

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

void __thiscall glslang::TQualifier::clear(TQualifier *this)

{
  TQualifier *this_local;
  
  *(ulong *)&this->field_0x8 = *(ulong *)&this->field_0x8 & 0xfffffffff1ffffff;
  *(ulong *)&this->field_0x8 = *(ulong *)&this->field_0x8 & 0xffffffffefffffff;
  makeTemporary(this);
  *(ulong *)&this->field_0x8 = *(ulong *)&this->field_0x8 & 0xfffffffffe00ffff;
  *(ulong *)&this->field_0x8 = *(ulong *)&this->field_0x8 & 0xffffffefffffffff;
  *(ulong *)&this->field_0x8 = *(ulong *)&this->field_0x8 & 0xfbffffffffffffff;
  *(ulong *)&this->field_0x8 = *(ulong *)&this->field_0x8 & 0xf7ffffffffffffff;
  *(ulong *)&this->field_0x8 = *(ulong *)&this->field_0x8 & 0xefffffffffffffff;
  *(ulong *)&this->field_0x8 = *(ulong *)&this->field_0x8 & 0xfffffff7ffffffff;
  return;
}

Assistant:

void clear()
    {
        precision = EpqNone;
        invariant = false;
        makeTemporary();
        declaredBuiltIn = EbvNone;
        noContraction = false;
        nullInit = false;
        spirvByReference = false;
        spirvLiteral = false;
        defaultBlock = false;
    }